

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateCursorImage(_GLFWwindow *window)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x74) == 0x34001) {
    if (*(long *)(in_RDI + 0x48) == 0) {
      XUndefineCursor(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x340));
    }
    else {
      XDefineCursor(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x340),
                    *(undefined8 *)(*(long *)(in_RDI + 0x48) + 8));
    }
  }
  else {
    XDefineCursor(_glfw.x11.display,*(undefined8 *)(in_RDI + 0x340),_glfw.x11.hiddenCursorHandle);
  }
  return;
}

Assistant:

static void updateCursorImage(_GLFWwindow* window)
{
    if (window->cursorMode == GLFW_CURSOR_NORMAL)
    {
        if (window->cursor)
        {
            XDefineCursor(_glfw.x11.display, window->x11.handle,
                          window->cursor->x11.handle);
        }
        else
            XUndefineCursor(_glfw.x11.display, window->x11.handle);
    }
    else
    {
        XDefineCursor(_glfw.x11.display, window->x11.handle,
                      _glfw.x11.hiddenCursorHandle);
    }
}